

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

void __thiscall
WScriptJsrt::ModuleMessage::ModuleMessage
          (ModuleMessage *this,JsModuleRecord module,JsValueRef specifier,string *fullPathPtr)

{
  string *this_00;
  string *fullPathPtr_local;
  JsValueRef specifier_local;
  JsModuleRecord module_local;
  ModuleMessage *this_local;
  
  MessageBase::MessageBase(&this->super_MessageBase,0);
  (this->super_MessageBase)._vptr_MessageBase = (_func_int **)&PTR__ModuleMessage_001d2250;
  this->moduleRecord = module;
  this->specifier = specifier;
  this->fullPath = (string *)0x0;
  ChakraRTInterface::JsAddRef(module,(uint *)0x0);
  if (specifier != (JsValueRef)0x0) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string(this_00,(string *)fullPathPtr);
    this->fullPath = (string *)this_00;
    ChakraRTInterface::JsAddRef(specifier,(uint *)0x0);
  }
  return;
}

Assistant:

WScriptJsrt::ModuleMessage::ModuleMessage(JsModuleRecord module, JsValueRef specifier, std::string* fullPathPtr)
    : MessageBase(0), moduleRecord(module), specifier(specifier)
{
    fullPath = nullptr;
    ChakraRTInterface::JsAddRef(module, nullptr);
    if (specifier != nullptr)
    {
        fullPath = new std::string (*fullPathPtr);
        // nullptr specifier means a Promise to execute; non-nullptr means a "fetch" operation.
        ChakraRTInterface::JsAddRef(specifier, nullptr);
    }
}